

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_elf_load_headers.c
# Opt level: O0

int get_counts_from_sec64_zero
              (dwarf_elf_object_access_internals_t *ep,Dwarf_Unsigned offset,
              Dwarf_Bool *have_shdr_count,Dwarf_Unsigned *shdr_count,
              Dwarf_Bool *have_shstrndx_number,Dwarf_Unsigned *shstrndx_number,int *errcode)

{
  generic_ehdr *pgVar1;
  generic_ehdr *geh;
  Dwarf_Unsigned size;
  undefined1 local_120 [4];
  int res;
  generic_shdr shdg;
  dw_elf64_shdr shd64;
  Dwarf_Unsigned *shstrndx_number_local;
  Dwarf_Bool *have_shstrndx_number_local;
  Dwarf_Unsigned *shdr_count_local;
  Dwarf_Bool *have_shdr_count_local;
  Dwarf_Unsigned offset_local;
  dwarf_elf_object_access_internals_t *ep_local;
  
  pgVar1 = ep->f_ehdr;
  memcpy(&shdg.gh_is_dwarf,&shd64zero,0x40);
  memcpy(local_120,&shdgzero,0xa0);
  ep_local._4_4_ =
       _dwarf_object_read_random(ep->f_fd,&shdg.gh_is_dwarf,offset,0x40,ep->f_filesize,errcode);
  if (ep_local._4_4_ == 0) {
    copysection64(ep,(generic_shdr *)local_120,(dw_elf64_shdr *)&shdg.gh_is_dwarf);
    if (pgVar1->ge_shnum_extended != 0) {
      pgVar1->ge_shnum = shdg.gh_offset;
      pgVar1->ge_shnum_in_shnum = 1;
      if (pgVar1->ge_shnum < 3) {
        *errcode = 0x1ee;
        return 1;
      }
    }
    *have_shdr_count = 1;
    *shdr_count = pgVar1->ge_shnum;
    if (pgVar1->ge_strndx_extended != 0) {
      pgVar1->ge_shstrndx = shdg.gh_size;
      pgVar1->ge_strndx_in_strndx = 1;
    }
    if (((pgVar1->ge_shnum_in_shnum == 0) || (pgVar1->ge_strndx_in_strndx == 0)) ||
       (pgVar1->ge_shstrndx < pgVar1->ge_shnum)) {
      *have_shstrndx_number = 1;
      *shstrndx_number = pgVar1->ge_shstrndx;
      ep_local._4_4_ = 0;
    }
    else {
      *errcode = 0x1ed;
      ep_local._4_4_ = 1;
    }
  }
  return ep_local._4_4_;
}

Assistant:

static int
get_counts_from_sec64_zero(
    dwarf_elf_object_access_internals_t * ep,
    Dwarf_Unsigned offset,
    Dwarf_Bool     *have_shdr_count,
    Dwarf_Unsigned *shdr_count,
    Dwarf_Bool     *have_shstrndx_number,
    Dwarf_Unsigned *shstrndx_number,
    int            *errcode)
{
    dw_elf64_shdr       shd64;
    struct generic_shdr shdg;
    int res = 0;
    Dwarf_Unsigned size = sizeof(shd64);
    struct generic_ehdr * geh  = ep->f_ehdr;

    shd64 =  shd64zero;
    shdg  = shdgzero;
    res = RRMOA(ep->f_fd,&shd64,offset,size,
        ep->f_filesize,errcode);
    if (res != DW_DLV_OK) {
        return res;
    }
    copysection64(ep,&shdg,&shd64);
    if (geh->ge_shnum_extended) {
        geh->ge_shnum = shdg.gh_size;
        geh->ge_shnum_in_shnum = TRUE;
        if (geh->ge_shnum  < 3) {
            *errcode = DW_DLE_TOO_FEW_SECTIONS;
            return DW_DLV_ERROR;
        }
    }
    *have_shdr_count = TRUE;
    *shdr_count = geh->ge_shnum;
    if (geh->ge_strndx_extended) {
        geh->ge_shstrndx = shdg.gh_link;
        geh->ge_strndx_in_strndx = TRUE;
    }
    if (geh->ge_shnum_in_shnum    &&
        geh->ge_strndx_in_strndx &&
        (geh->ge_shstrndx >= geh->ge_shnum)) {
            *errcode = DW_DLE_NO_SECT_STRINGS;
            return DW_DLV_ERROR;
    }

    *have_shstrndx_number = TRUE;
    *shstrndx_number = geh->ge_shstrndx;
    return DW_DLV_OK;
}